

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_create_any_datatree
                 (ly_ctx *ctx,ly_in *value_in,LYD_ANYDATA_VALUETYPE value_type,ly_bool log,
                 lyd_node **tree)

{
  uint32_t local_54;
  uint32_t *puStack_50;
  uint32_t temp_lo;
  uint32_t *prev_lo;
  uint32_t int_opts;
  uint32_t parse_opts;
  lyd_ctx *lydctx;
  lyd_node **pplStack_30;
  LY_ERR rc;
  lyd_node **tree_local;
  ly_bool log_local;
  ly_in *plStack_20;
  LYD_ANYDATA_VALUETYPE value_type_local;
  ly_in *value_in_local;
  ly_ctx *ctx_local;
  
  lydctx._4_4_ = LY_SUCCESS;
  _int_opts = (lyd_ctx *)0x0;
  puStack_50 = (uint32_t *)0x0;
  local_54 = 0;
  *tree = (lyd_node *)0x0;
  prev_lo._4_4_ = 0x50000;
  prev_lo._0_4_ = 0x30;
  pplStack_30 = tree;
  tree_local._3_1_ = log;
  tree_local._4_4_ = value_type;
  plStack_20 = value_in;
  value_in_local = (ly_in *)ctx;
  if (log == '\0') {
    puStack_50 = ly_temp_log_options(&local_54);
  }
  switch(tree_local._4_4_) {
  case LYD_ANYDATA_DATATREE:
  case LYD_ANYDATA_STRING:
    ly_log((ly_ctx *)value_in_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c",
           0x11c);
    return LY_EINT;
  case LYD_ANYDATA_XML:
    lydctx._4_4_ = lyd_parse_xml((ly_ctx *)value_in_local,(lysc_ext_instance *)0x0,(lyd_node *)0x0,
                                 pplStack_30,plStack_20,prev_lo._4_4_,0,(uint32_t)prev_lo,
                                 (ly_set *)0x0,(ly_bool *)0x0,(lyd_ctx **)&int_opts);
    break;
  case LYD_ANYDATA_JSON:
    lydctx._4_4_ = lyd_parse_json((ly_ctx *)value_in_local,(lysc_ext_instance *)0x0,(lyd_node *)0x0,
                                  pplStack_30,plStack_20,prev_lo._4_4_,0,(uint32_t)prev_lo,
                                  (ly_set *)0x0,(ly_bool *)0x0,(lyd_ctx **)&int_opts);
    break;
  case LYD_ANYDATA_LYB:
    lydctx._4_4_ = lyd_parse_lyb((ly_ctx *)value_in_local,(lysc_ext_instance *)0x0,(lyd_node *)0x0,
                                 pplStack_30,plStack_20,prev_lo._4_4_ | 0x20000,0,(uint32_t)prev_lo,
                                 (ly_set *)0x0,(ly_bool *)0x0,(lyd_ctx **)&int_opts);
  }
  if (_int_opts != (lyd_ctx *)0x0) {
    (*_int_opts->free)(_int_opts);
  }
  if (tree_local._3_1_ == '\0') {
    ly_temp_log_options(puStack_50);
  }
  if ((lydctx._4_4_ != LY_SUCCESS) && (*pplStack_30 != (lyd_node *)0x0)) {
    lyd_free_siblings(*pplStack_30);
    *pplStack_30 = (lyd_node *)0x0;
  }
  return lydctx._4_4_;
}

Assistant:

static LY_ERR
lyd_create_any_datatree(const struct ly_ctx *ctx, struct ly_in *value_in, LYD_ANYDATA_VALUETYPE value_type, ly_bool log,
        struct lyd_node **tree)
{
    LY_ERR rc = LY_SUCCESS;
    struct lyd_ctx *lydctx = NULL;
    uint32_t parse_opts, int_opts, *prev_lo = NULL, temp_lo = 0;

    *tree = NULL;

    /* set options */
    parse_opts = LYD_PARSE_ONLY | LYD_PARSE_OPAQ;
    int_opts = LYD_INTOPT_ANY | LYD_INTOPT_WITH_SIBLINGS;

    if (!log) {
        /* no logging */
        prev_lo = ly_temp_log_options(&temp_lo);
    }

    switch (value_type) {
    case LYD_ANYDATA_DATATREE:
    case LYD_ANYDATA_STRING:
        /* unreachable */
        LOGINT_RET(ctx);
    case LYD_ANYDATA_XML:
        rc = lyd_parse_xml(ctx, NULL, NULL, tree, value_in, parse_opts, 0, int_opts, NULL, NULL, &lydctx);
        break;
    case LYD_ANYDATA_JSON:
        rc = lyd_parse_json(ctx, NULL, NULL, tree, value_in, parse_opts, 0, int_opts, NULL, NULL, &lydctx);
        break;
    case LYD_ANYDATA_LYB:
        rc = lyd_parse_lyb(ctx, NULL, NULL, tree, value_in, parse_opts | LYD_PARSE_STRICT, 0, int_opts, NULL, NULL, &lydctx);
        break;
    }
    if (lydctx) {
        lydctx->free(lydctx);
    }

    if (!log) {
        /* restore logging */
        ly_temp_log_options(prev_lo);
    }
    if (rc && *tree) {
        lyd_free_siblings(*tree);
        *tree = NULL;
    }
    return rc;
}